

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

void __thiscall leveldb::VersionEdit::EncodeTo(VersionEdit *this,string *dst)

{
  FileMetaData *pFVar1;
  ulong uVar2;
  string *psVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  FileMetaData *pFVar7;
  const_reference pvVar8;
  Slice local_90;
  Slice local_80;
  FileMetaData *local_70;
  FileMetaData *f;
  size_t i_1;
  pair<int,_unsigned_long> *deleted_file_kvp;
  iterator __end1;
  iterator __begin1;
  DeletedFileSet *__range1;
  ulong local_30;
  size_t i;
  string *local_18;
  string *dst_local;
  VersionEdit *this_local;
  
  local_18 = dst;
  dst_local = &this->comparator_;
  if ((this->has_comparator_ & 1U) != 0) {
    PutVarint32(dst,1);
    psVar3 = local_18;
    Slice::Slice((Slice *)&i,&this->comparator_);
    PutLengthPrefixedSlice(psVar3,(Slice *)&i);
  }
  if ((this->has_log_number_ & 1U) != 0) {
    PutVarint32(local_18,2);
    PutVarint64(local_18,this->log_number_);
  }
  if ((this->has_prev_log_number_ & 1U) != 0) {
    PutVarint32(local_18,9);
    PutVarint64(local_18,this->prev_log_number_);
  }
  if ((this->has_next_file_number_ & 1U) != 0) {
    PutVarint32(local_18,3);
    PutVarint64(local_18,this->next_file_number_);
  }
  if ((this->has_last_sequence_ & 1U) != 0) {
    PutVarint32(local_18,4);
    PutVarint64(local_18,this->last_sequence_);
  }
  local_30 = 0;
  while( true ) {
    uVar2 = local_30;
    sVar5 = std::
            vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
            ::size(&this->compact_pointers_);
    if (sVar5 <= uVar2) break;
    PutVarint32(local_18,5);
    psVar3 = local_18;
    pvVar6 = std::
             vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ::operator[](&this->compact_pointers_,local_30);
    PutVarint32(psVar3,pvVar6->first);
    psVar3 = local_18;
    pvVar6 = std::
             vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ::operator[](&this->compact_pointers_,local_30);
    ___range1 = InternalKey::Encode(&pvVar6->second);
    PutLengthPrefixedSlice(psVar3,(Slice *)&__range1);
    local_30 = local_30 + 1;
  }
  __end1 = std::
           set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
           ::begin(&this->deleted_files_);
  deleted_file_kvp =
       (pair<int,_unsigned_long> *)
       std::
       set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
       ::end(&this->deleted_files_);
  while( true ) {
    bVar4 = std::operator!=(&__end1,(_Self *)&deleted_file_kvp);
    if (!bVar4) break;
    i_1 = (size_t)std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator*(&__end1);
    PutVarint32(local_18,6);
    PutVarint32(local_18,*(uint32_t *)i_1);
    PutVarint64(local_18,*(uint64_t *)(i_1 + 8));
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator++(&__end1);
  }
  f = (FileMetaData *)0x0;
  while( true ) {
    pFVar1 = f;
    pFVar7 = (FileMetaData *)
             std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::size(&this->new_files_);
    if (pFVar7 <= pFVar1) break;
    pvVar8 = std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::operator[](&this->new_files_,(size_type)f);
    local_70 = &pvVar8->second;
    PutVarint32(local_18,7);
    psVar3 = local_18;
    pvVar8 = std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::operator[](&this->new_files_,(size_type)f);
    PutVarint32(psVar3,pvVar8->first);
    PutVarint64(local_18,local_70->number);
    PutVarint64(local_18,local_70->file_size);
    psVar3 = local_18;
    local_80 = InternalKey::Encode(&local_70->smallest);
    PutLengthPrefixedSlice(psVar3,&local_80);
    psVar3 = local_18;
    local_90 = InternalKey::Encode(&local_70->largest);
    PutLengthPrefixedSlice(psVar3,&local_90);
    f = (FileMetaData *)((long)&f->refs + 1);
  }
  return;
}

Assistant:

void VersionEdit::EncodeTo(std::string* dst) const {
  if (has_comparator_) {
    PutVarint32(dst, kComparator);
    PutLengthPrefixedSlice(dst, comparator_);
  }
  if (has_log_number_) {
    PutVarint32(dst, kLogNumber);
    PutVarint64(dst, log_number_);
  }
  if (has_prev_log_number_) {
    PutVarint32(dst, kPrevLogNumber);
    PutVarint64(dst, prev_log_number_);
  }
  if (has_next_file_number_) {
    PutVarint32(dst, kNextFileNumber);
    PutVarint64(dst, next_file_number_);
  }
  if (has_last_sequence_) {
    PutVarint32(dst, kLastSequence);
    PutVarint64(dst, last_sequence_);
  }

  for (size_t i = 0; i < compact_pointers_.size(); i++) {
    PutVarint32(dst, kCompactPointer);
    PutVarint32(dst, compact_pointers_[i].first);  // level
    PutLengthPrefixedSlice(dst, compact_pointers_[i].second.Encode());
  }

  for (const auto& deleted_file_kvp : deleted_files_) {
    PutVarint32(dst, kDeletedFile);
    PutVarint32(dst, deleted_file_kvp.first);   // level
    PutVarint64(dst, deleted_file_kvp.second);  // file number
  }

  for (size_t i = 0; i < new_files_.size(); i++) {
    const FileMetaData& f = new_files_[i].second;
    PutVarint32(dst, kNewFile);
    PutVarint32(dst, new_files_[i].first);  // level
    PutVarint64(dst, f.number);
    PutVarint64(dst, f.file_size);
    PutLengthPrefixedSlice(dst, f.smallest.Encode());
    PutLengthPrefixedSlice(dst, f.largest.Encode());
  }
}